

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::AttachmentPromiseNode<capnp::LocalClient::BlockingScope>,_kj::_::PromiseDisposer>::
dispose(Own<kj::_::AttachmentPromiseNode<capnp::LocalClient::BlockingScope>,_kj::_::PromiseDisposer>
        *this)

{
  AttachmentPromiseNode<capnp::LocalClient::BlockingScope> *node;
  AttachmentPromiseNode<capnp::LocalClient::BlockingScope> *ptrCopy;
  Own<kj::_::AttachmentPromiseNode<capnp::LocalClient::BlockingScope>,_kj::_::PromiseDisposer>
  *this_local;
  
  node = this->ptr;
  if (node != (AttachmentPromiseNode<capnp::LocalClient::BlockingScope> *)0x0) {
    this->ptr = (AttachmentPromiseNode<capnp::LocalClient::BlockingScope> *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      StaticDisposer::dispose(ptrCopy);
    }
  }